

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CBuildVisitor.cpp
# Opt level: O0

void __thiscall CBuildVisitor::Visit(CBuildVisitor *this,CCallMethodExp *expression)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar1;
  pointer pIVar2;
  pointer pIVar3;
  CExpressionList *this_01;
  pointer pCVar4;
  reference this_02;
  CExpressionWrapper *this_03;
  CCallExpression *this_04;
  CNameExpression *this_05;
  mapped_type *pmVar5;
  element_type *peVar6;
  pointer pCVar7;
  mapped_type *pmVar8;
  element_type *peVar9;
  element_type *peVar10;
  undefined1 local_120 [8];
  shared_ptr<TypeInfo> returnTypeInfo;
  mapped_type methodInfo;
  shared_ptr<ClassInfo> classInfo;
  unique_ptr<const_IRT::CExpressionList,_std::default_delete<const_IRT::CExpressionList>_> local_e8;
  undefined1 local_d9;
  undefined1 local_d8 [64];
  unique_ptr<const_IRT::CNameExpression,_std::default_delete<const_IRT::CNameExpression>_> local_98;
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> local_90;
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> local_88;
  __normal_iterator<std::unique_ptr<IExpression,_std::default_delete<IExpression>_>_*,_std::vector<std::unique_ptr<IExpression,_std::default_delete<IExpression>_>,_std::allocator<std::unique_ptr<IExpression,_std::default_delete<IExpression>_>_>_>_>
  local_80;
  __normal_iterator<std::unique_ptr<IExpression,_std::default_delete<IExpression>_>_*,_std::vector<std::unique_ptr<IExpression,_std::default_delete<IExpression>_>,_std::allocator<std::unique_ptr<IExpression,_std::default_delete<IExpression>_>_>_>_>
  local_78;
  iterator it;
  vector<std::unique_ptr<IExpression,_std::default_delete<IExpression>_>,_std::allocator<std::unique_ptr<IExpression,_std::default_delete<IExpression>_>_>_>
  *arguments;
  CExpressionList *expressionListIrt;
  string local_48 [8];
  string mineMethodObjectClassName;
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> local_28;
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> local_20;
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> objectExpression;
  CCallMethodExp *expression_local;
  CBuildVisitor *this_local;
  
  objectExpression._M_t.
  super___uniq_ptr_impl<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>._M_t.
  super__Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>.
  super__Head_base<0UL,_const_IRT::CExpression_*,_false>._M_head_impl =
       (__uniq_ptr_data<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>,_true,_true>
        )(__uniq_ptr_data<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>,_true,_true>
          )expression;
  std::operator<<((ostream *)&std::cout,"IRT builder: CCallMethod\n");
  pIVar2 = std::unique_ptr<IExpression,_std::default_delete<IExpression>_>::operator->
                     ((unique_ptr<IExpression,_std::default_delete<IExpression>_> *)
                      ((long)objectExpression._M_t.
                             super___uniq_ptr_impl<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>
                             .super__Head_base<0UL,_const_IRT::CExpression_*,_false>._M_head_impl +
                      0x18));
  (**(pIVar2->super_PositionedNode).super_INode._vptr_INode)(pIVar2,this);
  pIVar3 = std::unique_ptr<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>::
           operator->(&this->wrapper);
  (**pIVar3->_vptr_ISubtreeWrapper)();
  std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::unique_ptr
            (&local_20,&local_28);
  std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::~unique_ptr
            (&local_28);
  std::__cxx11::string::string(local_48,(string *)&this->currentObjectClassName);
  bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_48,"");
  if (!bVar1) {
    __assert_fail("mineMethodObjectClassName != \"\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/IRT/visitors/CBuildVisitor.cpp"
                  ,0x98,"virtual void CBuildVisitor::Visit(CCallMethodExp &)");
  }
  this_01 = (CExpressionList *)operator_new(0x20);
  IRT::CExpressionList::CExpressionList(this_01,(CExpression *)0x0);
  pCVar4 = std::unique_ptr<CExpList,_std::default_delete<CExpList>_>::operator->
                     ((unique_ptr<CExpList,_std::default_delete<CExpList>_> *)
                      ((long)objectExpression._M_t.
                             super___uniq_ptr_impl<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>
                             .super__Head_base<0UL,_const_IRT::CExpression_*,_false>._M_head_impl +
                      0x28));
  std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::unique_ptr
            ((unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> *)&it
             ,&local_20);
  IRT::CExpressionList::Add
            (this_01,(unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>
                      *)&it);
  std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::~unique_ptr
            ((unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> *)&it
            );
  local_78._M_current =
       (unique_ptr<IExpression,_std::default_delete<IExpression>_> *)
       std::
       vector<std::unique_ptr<IExpression,_std::default_delete<IExpression>_>,_std::allocator<std::unique_ptr<IExpression,_std::default_delete<IExpression>_>_>_>
       ::begin(&pCVar4->exps);
  while( true ) {
    local_80._M_current =
         (unique_ptr<IExpression,_std::default_delete<IExpression>_> *)
         std::
         vector<std::unique_ptr<IExpression,_std::default_delete<IExpression>_>,_std::allocator<std::unique_ptr<IExpression,_std::default_delete<IExpression>_>_>_>
         ::end(&pCVar4->exps);
    bVar1 = __gnu_cxx::operator!=(&local_78,&local_80);
    if (!bVar1) break;
    this_02 = __gnu_cxx::
              __normal_iterator<std::unique_ptr<IExpression,_std::default_delete<IExpression>_>_*,_std::vector<std::unique_ptr<IExpression,_std::default_delete<IExpression>_>,_std::allocator<std::unique_ptr<IExpression,_std::default_delete<IExpression>_>_>_>_>
              ::operator*(&local_78);
    pIVar2 = std::unique_ptr<IExpression,_std::default_delete<IExpression>_>::operator->(this_02);
    (**(pIVar2->super_PositionedNode).super_INode._vptr_INode)(pIVar2,this);
    pIVar3 = std::unique_ptr<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>::
             operator->(&this->wrapper);
    (**pIVar3->_vptr_ISubtreeWrapper)(&local_90);
    std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
    unique_ptr(&local_88,&local_90);
    IRT::CExpressionList::Add(this_01,&local_88);
    std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
    ~unique_ptr(&local_88);
    std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
    ~unique_ptr(&local_90);
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<IExpression,_std::default_delete<IExpression>_>_*,_std::vector<std::unique_ptr<IExpression,_std::default_delete<IExpression>_>,_std::allocator<std::unique_ptr<IExpression,_std::default_delete<IExpression>_>_>_>_>
    ::operator++(&local_78);
  }
  this_03 = (CExpressionWrapper *)operator_new(0x10);
  this_04 = (CCallExpression *)operator_new(0x18);
  this_05 = (CNameExpression *)operator_new(0x28);
  local_d9 = 1;
  std::unique_ptr<CIdExp,_std::default_delete<CIdExp>_>::operator->
            ((unique_ptr<CIdExp,_std::default_delete<CIdExp>_> *)
             ((long)objectExpression._M_t.
                    super___uniq_ptr_impl<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>
                    .super__Head_base<0UL,_const_IRT::CExpression_*,_false>._M_head_impl + 0x20));
  GetMethodFullName((CBuildVisitor *)local_d8,(string *)this,(string *)local_48);
  IRT::CLabel::CLabel((CLabel *)(local_d8 + 0x20),(string *)local_d8);
  IRT::CNameExpression::CNameExpression(this_05,(CLabel *)(local_d8 + 0x20));
  local_d9 = 0;
  std::unique_ptr<IRT::CNameExpression_const,std::default_delete<IRT::CNameExpression_const>>::
  unique_ptr<std::default_delete<IRT::CNameExpression_const>,void>
            ((unique_ptr<IRT::CNameExpression_const,std::default_delete<IRT::CNameExpression_const>>
              *)&local_98,this_05);
  std::unique_ptr<IRT::CExpressionList_const,std::default_delete<IRT::CExpressionList_const>>::
  unique_ptr<std::default_delete<IRT::CExpressionList_const>,void>
            ((unique_ptr<IRT::CExpressionList_const,std::default_delete<IRT::CExpressionList_const>>
              *)&local_e8,this_01);
  IRT::CCallExpression::CCallExpression(this_04,&local_98,&local_e8);
  IRT::CExpressionWrapper::CExpressionWrapper(this_03,(CExpression *)this_04);
  updateSubtreeWrapper(this,(ISubtreeWrapper *)this_03);
  std::unique_ptr<const_IRT::CExpressionList,_std::default_delete<const_IRT::CExpressionList>_>::
  ~unique_ptr(&local_e8);
  std::unique_ptr<const_IRT::CNameExpression,_std::default_delete<const_IRT::CNameExpression>_>::
  ~unique_ptr(&local_98);
  IRT::CLabel::~CLabel((CLabel *)(local_d8 + 0x20));
  std::__cxx11::string::~string((string *)local_d8);
  pmVar5 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ClassInfo>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ClassInfo>_>_>_>
           ::at(&this->symbolTable->classes,(key_type *)local_48);
  this_00 = &methodInfo.super___shared_ptr<MethodInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  std::shared_ptr<ClassInfo>::shared_ptr((shared_ptr<ClassInfo> *)this_00,pmVar5);
  peVar6 = std::__shared_ptr_access<ClassInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<ClassInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      this_00);
  pCVar7 = std::unique_ptr<CIdExp,_std::default_delete<CIdExp>_>::operator->
                     ((unique_ptr<CIdExp,_std::default_delete<CIdExp>_> *)
                      ((long)objectExpression._M_t.
                             super___uniq_ptr_impl<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>
                             .super__Head_base<0UL,_const_IRT::CExpression_*,_false>._M_head_impl +
                      0x20));
  pmVar8 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<MethodInfo>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<MethodInfo>_>_>_>
           ::operator[](&peVar6->methods,&pCVar7->name);
  std::shared_ptr<MethodInfo>::shared_ptr
            ((shared_ptr<MethodInfo> *)
             &returnTypeInfo.super___shared_ptr<TypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             pmVar8);
  peVar9 = std::__shared_ptr_access<MethodInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<MethodInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &returnTypeInfo.super___shared_ptr<TypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount);
  std::shared_ptr<TypeInfo>::shared_ptr((shared_ptr<TypeInfo> *)local_120,&peVar9->returnType);
  peVar10 = std::__shared_ptr_access<TypeInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                      ((__shared_ptr_access<TypeInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                       local_120);
  if ((peVar10->isPrimitive & 1U) == 0) {
    peVar10 = std::__shared_ptr_access<TypeInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<TypeInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                         local_120);
    std::__cxx11::string::operator=
              ((string *)&this->currentObjectClassName,(string *)&peVar10->className);
  }
  else {
    std::__cxx11::string::operator=((string *)&this->currentObjectClassName,"");
  }
  std::shared_ptr<TypeInfo>::~shared_ptr((shared_ptr<TypeInfo> *)local_120);
  std::shared_ptr<MethodInfo>::~shared_ptr
            ((shared_ptr<MethodInfo> *)
             &returnTypeInfo.super___shared_ptr<TypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::shared_ptr<ClassInfo>::~shared_ptr
            ((shared_ptr<ClassInfo> *)
             &methodInfo.super___shared_ptr<MethodInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__cxx11::string::~string(local_48);
  std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::~unique_ptr
            (&local_20);
  return;
}

Assistant:

void CBuildVisitor::Visit( CCallMethodExp &expression ) {

    std::cout << "IRT builder: CCallMethod\n";

    expression.objectExpression->Accept( *this );
    std::unique_ptr<const IRT::CExpression> objectExpression = std::move( wrapper->ToExpression( ));
    std::string mineMethodObjectClassName = currentObjectClassName;
    assert( mineMethodObjectClassName != "" );

    IRT::CExpressionList *expressionListIrt = new IRT::CExpressionList( );
    std::vector<std::unique_ptr<IExpression> > &arguments = expression.args->exps;
    expressionListIrt->Add( std::move( objectExpression ));
    for ( auto it = arguments.begin( ); it != arguments.end( ); ++it ) {
        ( *it )->Accept( *this );
        expressionListIrt->Add( std::move( wrapper->ToExpression( )));
    }

    updateSubtreeWrapper( new IRT::CExpressionWrapper(
            new IRT::CCallExpression(
                    std::unique_ptr<const IRT::CNameExpression>( new IRT::CNameExpression(
                            IRT::CLabel( GetMethodFullName( mineMethodObjectClassName, expression.methodName->name ))
                    )),
                    std::unique_ptr<const IRT::CExpressionList>( expressionListIrt ))
    ));

    std::shared_ptr<ClassInfo> classInfo = symbolTable->classes.at( mineMethodObjectClassName );
    auto methodInfo = classInfo->methods[ expression.methodName->name ];
    auto returnTypeInfo = methodInfo->returnType;
    if ( returnTypeInfo->isPrimitive ) {
        currentObjectClassName = "";
    } else {
        currentObjectClassName = returnTypeInfo->className;
    }
}